

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode operate(GlobalConfig *config,int argc,char **argv)

{
  OperationConfig *pOVar1;
  int iVar2;
  ParameterError PVar3;
  CURLcode CVar4;
  size_t i;
  OperationConfig **ppOVar5;
  
  setlocale(6,"");
  if ((((argc == 1) ||
       ((iVar2 = curl_strequal(argv[1],"-q"), iVar2 == 0 &&
        (iVar2 = curl_strequal(argv[1],"--disable"), iVar2 == 0)))) &&
      (parseconfig((char *)0x0,config), argc < 2)) && (config->first->url_list == (getout *)0x0)) {
    helpf(config->errors,(char *)0x0);
LAB_0011368d:
    return CURLE_FAILED_INIT;
  }
  PVar3 = parse_args(config,argc,argv);
  switch(PVar3) {
  case PARAM_OK:
    if ((config->libcurl != (char *)0x0) && (CVar4 = easysrc_init(), CVar4 != CURLE_OK)) {
      helpf(config->errors,"out of memory\n");
      return CVar4;
    }
    CVar4 = CURLE_OK;
    ppOVar5 = &config->first;
    i = 0;
    while ((CVar4 == CURLE_OK && (pOVar1 = *ppOVar5, pOVar1 != (OperationConfig *)0x0))) {
      CVar4 = get_args(pOVar1,i);
      i = i + 1;
      ppOVar5 = &pOVar1->next;
    }
    config->current = config->first;
    while ((CVar4 == CURLE_OK && (config->current != (OperationConfig *)0x0))) {
      CVar4 = operate_do(config,config->current);
      pOVar1 = config->current->next;
      config->current = pOVar1;
      if ((pOVar1 != (OperationConfig *)0x0) && (pOVar1->easy != (CURL *)0x0)) {
        curl_easy_reset();
      }
    }
    if (config->libcurl == (char *)0x0) {
      return CVar4;
    }
    easysrc_cleanup();
    dumpeasysrc(config);
    return CVar4;
  default:
    goto LAB_0011368d;
  case PARAM_HELP_REQUESTED:
    tool_help();
    break;
  case PARAM_MANUAL_REQUESTED:
    hugehelp();
    break;
  case PARAM_VERSION_INFO_REQUESTED:
    tool_version_info();
    break;
  case PARAM_ENGINES_REQUESTED:
    tool_list_engines(config->easy);
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  return CURLE_OK;
}

Assistant:

CURLcode operate(struct GlobalConfig *config, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;

  /* Setup proper locale from environment */
#ifdef HAVE_SETLOCALE
  setlocale(LC_ALL, "");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (!curl_strequal(argv[1], "-q") &&
      !curl_strequal(argv[1], "--disable"))) {
    parseconfig(NULL, config); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!config->first->url_list)) {
      helpf(config->errors, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(config, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help();
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines(config->easy);
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
#ifndef CURL_DISABLE_LIBCURL_OPTION
      if(config->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }
#endif

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = config->first;

        /* Get the required arguments for each operation */
        while(!result && operation) {
          result = get_args(operation, count++);

          operation = operation->next;
        }

        /* Set the current operation pointer */
        config->current = config->first;

        /* Perform each operation */
        while(!result && config->current) {
          result = operate_do(config, config->current);

          config->current = config->current->next;

          if(config->current && config->current->easy)
            curl_easy_reset(config->current->easy);
        }

#ifndef CURL_DISABLE_LIBCURL_OPTION
        if(config->libcurl) {
          /* Cleanup the libcurl source output */
          easysrc_cleanup();

          /* Dump the libcurl code if previously enabled */
          dumpeasysrc(config);
        }
#endif
      }
      else
        helpf(config->errors, "out of memory\n");
    }
  }

  return result;
}